

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void toml::detail::
     throw_bad_cast<(toml::value_t)9,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
               (string *funcname,value_t actual,
               basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v)

{
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  type_error *this;
  char (*args_1) [13];
  value_t *in_R8;
  source_location local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18a;
  undefined1 local_189;
  string local_188;
  source_location local_168;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  iterator local_a0;
  size_type local_98;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  char local_61;
  string local_60;
  string local_40;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *local_20;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v_local;
  string *psStack_10;
  value_t actual_local;
  string *funcname_local;
  
  local_20 = v;
  v_local._7_1_ = actual;
  psStack_10 = funcname;
  this = (type_error *)__cxa_allocate_exception(0x78);
  local_61 = '\t';
  args_1 = (char (*) [13])&local_61;
  concat_to_string<std::__cxx11::string_const&,char_const(&)[13],toml::value_t>
            (&local_60,(toml *)psStack_10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"bad_cast to ",
             args_1,in_R8);
  local_189 = 1;
  local_118 = &local_110;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
            (&local_168,local_20);
  concat_to_string<char_const(&)[20],toml::value_t&>
            (&local_188,(toml *)"the actual type is ",(char (*) [20])((long)&v_local + 7),
             (value_t *)args_1);
  std::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_110,&local_168,&local_188);
  local_189 = 0;
  local_a0 = &local_110;
  local_98 = 1;
  std::
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_18a);
  __l._M_len = local_98;
  __l._M_array = local_a0;
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_90,__l,&local_18a);
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a8);
  format_underline(&local_40,&local_60,&local_90,&local_1a8,false);
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
            (&local_1f8,local_20);
  type_error::type_error(this,&local_40,&local_1f8);
  __cxa_throw(this,&type_error::typeinfo,type_error::~type_error);
}

Assistant:

[[noreturn]] inline void
throw_bad_cast(const std::string& funcname, value_t actual, const Value& v)
{
    throw type_error(detail::format_underline(
        concat_to_string(funcname, "bad_cast to ", Expected), {
            {v.location(), concat_to_string("the actual type is ", actual)}
        }), v.location());
}